

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.h
# Opt level: O3

void __thiscall Shader::checkCompileErrors(Shader *this,uint shader,string *type)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  int success;
  char infoLog [1024];
  int local_41c;
  GLchar local_418 [1024];
  
  iVar1 = std::__cxx11::string::compare((char *)type);
  if (iVar1 == 0) {
    (*glad_glGetProgramiv)(shader,0x8b82,&local_41c);
    if (local_41c != 0) {
      return;
    }
    (*glad_glGetProgramInfoLog)(shader,0x400,(GLsizei *)0x0,local_418);
    pcVar5 = "ERROR::PROGRAM_LINKING_ERROR of type: ";
    lVar4 = 0x26;
  }
  else {
    (*glad_glGetShaderiv)(shader,0x8b81,&local_41c);
    if (local_41c != 0) {
      return;
    }
    (*glad_glGetShaderInfoLog)(shader,0x400,(GLsizei *)0x0,local_418);
    pcVar5 = "ERROR::SHADER_COMPILATION_ERROR of type: ";
    lVar4 = 0x29;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(type->_M_dataplus)._M_p,type->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  sVar3 = strlen(local_418);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_418,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\n -- --------------------------------------------------- -- ",0x3c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void checkCompileErrors(unsigned int shader, std::string type)
    {
        int success;
        char infoLog[1024];
        if (type != "PROGRAM")
        {
            glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
            if (!success)
            {
                glGetShaderInfoLog(shader, 1024, nullptr, infoLog);
                std::cout << "ERROR::SHADER_COMPILATION_ERROR of type: " << type << "\n" << 
                infoLog << "\n -- --------------------------------------------------- -- " << std::endl;
            }
        }
        else
        {
            glGetProgramiv(shader, GL_LINK_STATUS, &success);
            if(!success)
            {
                glGetProgramInfoLog(shader, 1024, nullptr, infoLog);
                std::cout << "ERROR::PROGRAM_LINKING_ERROR of type: " << type << "\n" << 
                infoLog << "\n -- --------------------------------------------------- -- " << std::endl;
            }
        }
    }